

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transportParser.h
# Opt level: O1

void __thiscall IO::TransportParser::~TransportParser(TransportParser *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->transportfilestring_)._M_dataplus._M_p;
  paVar2 = &(this->transportfilestring_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->tranfile_)._M_dataplus._M_p;
  paVar2 = &(this->tranfile_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~TransportParser(){}